

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O2

void __thiscall
Coverage_variablePair_Test::Coverage_variablePair_Test(Coverage_variablePair_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0012ce28;
  return;
}

Assistant:

TEST(Coverage, variablePair)
{
    auto v = libcellml::Variable::create("var");
    auto variablePair1 = libcellml::VariablePair::create(nullptr, v);
    auto variablePair2 = libcellml::VariablePair::create(v, nullptr);
    auto variablePair3 = libcellml::VariablePair::create(v, v);

    EXPECT_FALSE(variablePair1->isValid());
    EXPECT_FALSE(variablePair2->isValid());
    EXPECT_TRUE(variablePair3->isValid());
}